

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O1

void __thiscall
EmmyDebuggerManager::SetHitDebugger(EmmyDebuggerManager *this,shared_ptr<Debugger> *debugger)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->breakDebuggerMtx);
  if (iVar1 == 0) {
    (this->hitDebugger).super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->hitDebugger).super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    pthread_mutex_unlock((pthread_mutex_t *)&this->breakDebuggerMtx);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void EmmyDebuggerManager::SetHitDebugger(std::shared_ptr<Debugger> debugger)
{
	std::lock_guard<std::mutex> lock(breakDebuggerMtx);
	hitDebugger = debugger;
}